

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::If::makeBeginElse(If *this)

{
  Id id;
  Block *this_00;
  If *this_local;
  
  createBranch(this->builder,true,this->mergeBlock);
  this_00 = (Block *)::operator_new(0x90);
  id = getUniqueId(this->builder);
  Block::Block(this_00,id,this->function);
  this->elseBlock = this_00;
  spv::Function::addBlock(this->function,this->elseBlock);
  setBuildPoint(this->builder,this->elseBlock);
  return;
}

Assistant:

void Builder::If::makeBeginElse()
{
    // Close out the "then" by having it jump to the mergeBlock
    builder.createBranch(true, mergeBlock);

    // Make the first else block and add it to the function
    elseBlock = new Block(builder.getUniqueId(), *function);
    function->addBlock(elseBlock);

    // Start building the else block
    builder.setBuildPoint(elseBlock);
}